

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int p_col;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  pointer pnVar10;
  pointer pnVar11;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  iVar26 = this->thedim;
  if (0 < iVar26) {
    piVar7 = (this->row).perm;
    piVar8 = (this->temp).s_mark;
    iVar4 = (this->temp).stage;
    lVar28 = (long)iVar4;
    piVar9 = (this->u).row.len;
    lVar29 = 0;
    do {
      if ((piVar7[lVar29] < 0) && (piVar9[lVar29] == 1)) {
        iVar26 = (this->temp).stage;
        (this->temp).stage = iVar26 + 1;
        piVar8[iVar26] = (int)lVar29;
        iVar26 = this->thedim;
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < iVar26);
    if (iVar4 < (this->temp).stage) {
      do {
        iVar26 = piVar8[lVar28];
        iVar4 = (this->u).row.start[iVar26];
        pnVar10 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_col = (this->u).row.idx[iVar4];
        local_128.data._M_elems._0_8_ = *(undefined8 *)pnVar10[iVar4].m_backend.data._M_elems;
        local_128.data._M_elems._8_8_ =
             *(undefined8 *)((long)pnVar10[iVar4].m_backend.data._M_elems + 8);
        puVar2 = (uint *)((long)pnVar10[iVar4].m_backend.data._M_elems + 0x10);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)pnVar10[iVar4].m_backend.data._M_elems + 0x20);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)pnVar10[iVar4].m_backend.data._M_elems + 0x30);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_128.data._M_elems._56_5_ = local_88.m_backend.data._M_elems._56_5_;
        local_128.data._M_elems[0xf]._1_3_ = local_88.m_backend.data._M_elems[0xf]._1_3_;
        local_128.exp = pnVar10[iVar4].m_backend.exp;
        local_128.neg = pnVar10[iVar4].m_backend.neg;
        local_88.m_backend.fpclass = pnVar10[iVar4].m_backend.fpclass;
        local_88.m_backend.prec_elem = pnVar10[iVar4].m_backend.prec_elem;
        local_128.prec_elem = local_88.m_backend.prec_elem;
        local_128.fpclass = local_88.m_backend.fpclass;
        local_88.m_backend.data._M_elems._0_8_ = local_128.data._M_elems._0_8_;
        local_88.m_backend.data._M_elems._8_8_ = local_128.data._M_elems._8_8_;
        local_88.m_backend.data._M_elems._16_8_ = local_128.data._M_elems._16_8_;
        local_88.m_backend.data._M_elems._24_8_ = local_128.data._M_elems._24_8_;
        local_88.m_backend.data._M_elems._32_8_ = local_128.data._M_elems._32_8_;
        local_88.m_backend.data._M_elems._40_8_ = local_128.data._M_elems._40_8_;
        local_88.m_backend.data._M_elems._48_8_ = local_128.data._M_elems._48_8_;
        local_88.m_backend.exp = local_128.exp;
        local_88.m_backend.neg = local_128.neg;
        setPivot(this,(int)lVar28,p_col,iVar26,&local_88);
        (this->u).row.len[iVar26] = 0;
        iVar4 = (this->u).col.start[p_col];
        piVar7 = (this->u).col.idx;
        iVar5 = (this->temp).s_cact[p_col];
        iVar23 = makeLvec(this,iVar5 + -1,iVar26);
        piVar9 = (this->u).col.len;
        iVar6 = piVar9[p_col];
        iVar24 = iVar6 - iVar5;
        piVar9[p_col] = iVar24;
        if (0 < iVar5) {
          lVar29 = (long)iVar24;
          do {
            iVar5 = piVar7[iVar4 + lVar29];
            if (iVar5 != iVar26) {
              piVar9 = (this->u).row.len;
              iVar24 = piVar9[iVar5];
              piVar9[iVar5] = iVar24 + -1;
              lVar25 = (long)(iVar24 + -1 + (this->u).row.start[iVar5]);
              lVar21 = lVar25 * 0x50 + 0x50;
              lVar22 = lVar25 * 4;
              do {
                lVar30 = lVar22;
                lVar27 = lVar21;
                lVar21 = lVar27 + -0x50;
                lVar22 = lVar30 + -4;
              } while (*(int *)((long)(this->u).row.idx + lVar30) != p_col);
              (this->l).idx[iVar23] = iVar5;
              local_d8.fpclass = cpp_dec_float_finite;
              local_d8.prec_elem = 0x10;
              local_d8.data._M_elems[0] = 0;
              local_d8.data._M_elems[1] = 0;
              local_d8.data._M_elems[2] = 0;
              local_d8.data._M_elems[3] = 0;
              local_d8.data._M_elems[4] = 0;
              local_d8.data._M_elems[5] = 0;
              local_d8.data._M_elems[6] = 0;
              local_d8.data._M_elems[7] = 0;
              local_d8.data._M_elems[8] = 0;
              local_d8.data._M_elems[9] = 0;
              local_d8.data._M_elems[10] = 0;
              local_d8.data._M_elems[0xb] = 0;
              local_d8.data._M_elems[0xc] = 0;
              local_d8.data._M_elems[0xd] = 0;
              local_d8.data._M_elems._56_5_ = 0;
              local_d8.data._M_elems[0xf]._1_3_ = 0;
              local_d8.exp = 0;
              local_d8.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&local_d8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->u).row.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar27),&local_128);
              pnVar10 = (this->l).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)pnVar10[iVar23].m_backend.data._M_elems + 0x30);
              *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
              puVar2 = (uint *)((long)pnVar10[iVar23].m_backend.data._M_elems + 0x20);
              *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
              *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
              puVar2 = (uint *)((long)pnVar10[iVar23].m_backend.data._M_elems + 0x10);
              *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
              *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
              *(undefined8 *)pnVar10[iVar23].m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
              *(undefined8 *)((long)pnVar10[iVar23].m_backend.data._M_elems + 8) =
                   local_d8.data._M_elems._8_8_;
              pnVar10[iVar23].m_backend.exp = local_d8.exp;
              pnVar10[iVar23].m_backend.neg = local_d8.neg;
              pnVar10[iVar23].m_backend.fpclass = local_d8.fpclass;
              pnVar10[iVar23].m_backend.prec_elem = local_d8.prec_elem;
              iVar23 = iVar23 + 1;
              piVar9 = (this->u).row.idx;
              *(int *)((long)piVar9 + lVar30) = piVar9[lVar25];
              pnVar11 = (this->u).row.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar10 = pnVar11 + lVar25;
              uVar12 = (pnVar10->m_backend).data._M_elems[0];
              uVar13 = *(uint *)((long)(pnVar10->m_backend).data._M_elems + 4);
              uVar14 = *(uint *)((long)(pnVar10->m_backend).data._M_elems + 8);
              uVar15 = *(uint *)((long)(pnVar10->m_backend).data._M_elems + 0xc);
              puVar2 = (uint *)((long)pnVar11[lVar25].m_backend.data._M_elems + 0x10);
              uVar16 = *(undefined8 *)puVar2;
              uVar17 = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pnVar11[lVar25].m_backend.data._M_elems + 0x20);
              uVar18 = *(undefined8 *)puVar2;
              uVar19 = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pnVar11[lVar25].m_backend.data._M_elems + 0x30);
              uVar20 = *(undefined8 *)(puVar2 + 2);
              puVar3 = (undefined8 *)((long)pnVar11[-1].m_backend.data._M_elems + lVar27 + 0x30);
              *puVar3 = *(undefined8 *)puVar2;
              puVar3[1] = uVar20;
              puVar3 = (undefined8 *)((long)pnVar11[-1].m_backend.data._M_elems + lVar27 + 0x20);
              *puVar3 = uVar18;
              puVar3[1] = uVar19;
              puVar3 = (undefined8 *)((long)pnVar11[-1].m_backend.data._M_elems + lVar27 + 0x10);
              *puVar3 = uVar16;
              puVar3[1] = uVar17;
              puVar1 = (undefined4 *)((long)pnVar11[-1].m_backend.data._M_elems + lVar27);
              *puVar1 = uVar12;
              puVar1[1] = uVar13;
              puVar1[2] = uVar14;
              puVar1[3] = uVar15;
              *(int *)((long)(&pnVar11[-1].m_backend.data + 1) + lVar27) =
                   pnVar11[lVar25].m_backend.exp;
              *(bool *)((long)(&pnVar11[-1].m_backend.data + 1) + 4U + lVar27) =
                   pnVar11[lVar25].m_backend.neg;
              *(undefined8 *)((long)(&pnVar11[-1].m_backend.data + 1) + 8U + lVar27) =
                   *(undefined8 *)&pnVar11[lVar25].m_backend.fpclass;
              if (iVar24 == 2) {
                iVar24 = (this->temp).stage;
                (this->temp).stage = iVar24 + 1;
                piVar8[iVar24] = iVar5;
              }
              else if (iVar24 == 1) {
                this->stat = SINGULAR;
                return;
              }
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 < iVar6);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < (this->temp).stage);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}